

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::descriptor_unittest::FeaturesTest_Proto2Proto3EnumFeatures_Test::TestBody
          (FeaturesTest_Proto2Proto3EnumFeatures_Test *this)

{
  Descriptor *pDVar1;
  Descriptor *pDVar2;
  FieldDescriptor *this_00;
  FieldDescriptor *pFVar3;
  bool bVar4;
  FileDescriptor *pFVar5;
  FileDescriptor *this_01;
  Nonnull<const_char_*> pcVar6;
  undefined8 extraout_RAX;
  long v2;
  char *in_R9;
  pointer *__ptr;
  string_view file_text;
  string_view file_text_00;
  Metadata MVar7;
  AssertionResult gtest_ar_;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_60;
  AssertHelper local_58;
  internal local_50 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_48;
  string local_40;
  
  MVar7 = DescriptorProto::GetMetadata((DescriptorProto *)_DescriptorProto_default_instance_);
  ValidationErrorTest::BuildFileInTestPool((ValidationErrorTest *)this,(MVar7.descriptor)->file_);
  MVar7 = pb::CppFeatures::GetMetadata((CppFeatures *)pb::_CppFeatures_default_instance_);
  ValidationErrorTest::BuildFileInTestPool((ValidationErrorTest *)this,(MVar7.descriptor)->file_);
  file_text._M_str =
       "\n    name: \"foo3.proto\"\n    syntax: \"proto3\"\n    enum_type {\n      name: \"Enum3\"\n      value { name: \"DEFAULT_ENUM3\" number: 0 }\n      value { name: \"BAR_ENUM3\" number: 1 }\n    }\n    message_type {\n      name: \"Message3\"\n      field {\n        name: \"enum_field\"\n        number: 1\n        label: LABEL_OPTIONAL\n        type: TYPE_ENUM\n        type_name: \".Enum3\"\n      }\n    }\n  "
  ;
  file_text._M_len = 0x17a;
  pFVar5 = ValidationErrorTest::BuildFile((ValidationErrorTest *)this,file_text);
  file_text_00._M_str =
       "\n    name: \"foo2.proto\"\n    dependency: \"foo3.proto\"\n    enum_type {\n      name: \"Enum2\"\n      value { name: \"DEFAULT_ENUM2\" number: 0 }\n      value { name: \"BAR_ENUM2\" number: 1 }\n    }\n    message_type {\n      name: \"Message2\"\n      field {\n        name: \"enum_field2\"\n        number: 1\n        label: LABEL_OPTIONAL\n        type: TYPE_ENUM\n        type_name: \".Enum2\"\n      }\n      field {\n        name: \"enum_field3\"\n        number: 2\n        label: LABEL_OPTIONAL\n        type: TYPE_ENUM\n        type_name: \".Enum3\"\n      }\n    }\n  "
  ;
  file_text_00._M_len = 0x219;
  this_01 = ValidationErrorTest::BuildFile((ValidationErrorTest *)this,file_text_00);
  if ((long)this_01->message_type_count_ < 1) {
    pcVar6 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                       (0,(long)this_01->message_type_count_,"index < message_type_count()");
  }
  else {
    pcVar6 = (Nonnull<const_char_*>)0x0;
  }
  if (pcVar6 == (Nonnull<const_char_*>)0x0) {
    pDVar1 = this_01->message_types_;
    if ((long)pFVar5->message_type_count_ < 1) {
      pcVar6 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                         (0,(long)pFVar5->message_type_count_,"index < message_type_count()");
    }
    else {
      pcVar6 = (Nonnull<const_char_*>)0x0;
    }
    if (pcVar6 != (Nonnull<const_char_*>)0x0) goto LAB_005a59d6;
    pDVar2 = pFVar5->message_types_;
    v2 = (long)pDVar2->field_count_;
    if (v2 < 1) {
      pcVar6 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                         (0,v2,"index < field_count()");
    }
    else {
      pcVar6 = (Nonnull<const_char_*>)0x0;
    }
    if (pcVar6 != (Nonnull<const_char_*>)0x0) goto LAB_005a59e3;
    this_01 = (FileDescriptor *)pDVar2->fields_;
    if ((long)pDVar1->field_count_ < 1) {
      pcVar6 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                         (0,(long)pDVar1->field_count_,"index < field_count()");
    }
    else {
      pcVar6 = (Nonnull<const_char_*>)0x0;
    }
    if (pcVar6 == (Nonnull<const_char_*>)0x0) {
      this_00 = pDVar1->fields_;
      if ((long)pDVar1->field_count_ < 2) {
        pcVar6 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                           (1,(long)pDVar1->field_count_,"index < field_count()");
      }
      else {
        pcVar6 = (Nonnull<const_char_*>)0x0;
      }
      if (pcVar6 == (Nonnull<const_char_*>)0x0) {
        pFVar3 = pDVar1->fields_;
        bVar4 = FieldDescriptor::legacy_enum_field_treated_as_closed((FieldDescriptor *)this_01);
        local_50[0] = (internal)!bVar4;
        local_48 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (!(bool)local_50[0]) {
          testing::Message::Message((Message *)&local_60);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_40,local_50,
                     (AssertionResult *)"field_proto3->legacy_enum_field_treated_as_closed()","true"
                     ,"false",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_58,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                     ,0x2117,local_40._M_dataplus._M_p);
          testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_60);
          testing::internal::AssertHelper::~AssertHelper(&local_58);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_40._M_dataplus._M_p != &local_40.field_2) {
            operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
          }
          if (local_60._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_60._M_head_impl + 8))();
          }
        }
        if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_48,local_48);
        }
        local_50[0] = (internal)FieldDescriptor::legacy_enum_field_treated_as_closed(this_00);
        local_48 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (!(bool)local_50[0]) {
          testing::Message::Message((Message *)&local_60);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_40,local_50,
                     (AssertionResult *)"field_proto2_closed->legacy_enum_field_treated_as_closed()"
                     ,"false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_58,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                     ,0x2118,local_40._M_dataplus._M_p);
          testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_60);
          testing::internal::AssertHelper::~AssertHelper(&local_58);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_40._M_dataplus._M_p != &local_40.field_2) {
            operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
          }
          if (local_60._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_60._M_head_impl + 8))();
          }
        }
        if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_48,local_48);
        }
        local_50[0] = (internal)FieldDescriptor::legacy_enum_field_treated_as_closed(pFVar3 + 1);
        local_48 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (!(bool)local_50[0]) {
          testing::Message::Message((Message *)&local_60);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_40,local_50,
                     (AssertionResult *)"field_proto2_open->legacy_enum_field_treated_as_closed()",
                     "false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_58,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                     ,0x2119,local_40._M_dataplus._M_p);
          testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_60);
          testing::internal::AssertHelper::~AssertHelper(&local_58);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_40._M_dataplus._M_p != &local_40.field_2) {
            operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
          }
          if (local_60._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_60._M_head_impl + 8))();
          }
        }
        if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_48,local_48);
        }
        return;
      }
      goto LAB_005a59fd;
    }
  }
  else {
    TestBody();
LAB_005a59d6:
    TestBody();
LAB_005a59e3:
    TestBody();
  }
  TestBody();
LAB_005a59fd:
  TestBody();
  testing::internal::AssertHelper::~AssertHelper(&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  if (local_60._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_60._M_head_impl + 8))();
  }
  local_60._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)this_01,local_48);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

TEST_F(FeaturesTest, Proto2Proto3EnumFeatures) {
  BuildDescriptorMessagesInTestPool();
  BuildFileInTestPool(pb::CppFeatures::GetDescriptor()->file());
  const FileDescriptor* file_proto3 = BuildFile(R"pb(
    name: "foo3.proto"
    syntax: "proto3"
    enum_type {
      name: "Enum3"
      value { name: "DEFAULT_ENUM3" number: 0 }
      value { name: "BAR_ENUM3" number: 1 }
    }
    message_type {
      name: "Message3"
      field {
        name: "enum_field"
        number: 1
        label: LABEL_OPTIONAL
        type: TYPE_ENUM
        type_name: ".Enum3"
      }
    }
  )pb");
  const FileDescriptor* file_proto2 = BuildFile(R"pb(
    name: "foo2.proto"
    dependency: "foo3.proto"
    enum_type {
      name: "Enum2"
      value { name: "DEFAULT_ENUM2" number: 0 }
      value { name: "BAR_ENUM2" number: 1 }
    }
    message_type {
      name: "Message2"
      field {
        name: "enum_field2"
        number: 1
        label: LABEL_OPTIONAL
        type: TYPE_ENUM
        type_name: ".Enum2"
      }
      field {
        name: "enum_field3"
        number: 2
        label: LABEL_OPTIONAL
        type: TYPE_ENUM
        type_name: ".Enum3"
      }
    }
  )pb");
  const Descriptor* message_proto2 = file_proto2->message_type(0);
  const Descriptor* message_proto3 = file_proto3->message_type(0);
  const FieldDescriptor* field_proto3 = message_proto3->field(0);
  const FieldDescriptor* field_proto2_closed = message_proto2->field(0);
  const FieldDescriptor* field_proto2_open = message_proto2->field(1);

  EXPECT_FALSE(field_proto3->legacy_enum_field_treated_as_closed());
  EXPECT_TRUE(field_proto2_closed->legacy_enum_field_treated_as_closed());
  EXPECT_TRUE(field_proto2_open->legacy_enum_field_treated_as_closed());
}